

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout_json.c
# Opt level: O0

int jsonquoted(char *in,size_t len,dynbuf *out,_Bool lowercase)

{
  uchar uVar1;
  byte local_45;
  CURLcode local_44;
  char o;
  uchar *puStack_40;
  CURLcode result;
  uchar *in_end;
  uchar *i;
  dynbuf *pdStack_28;
  _Bool lowercase_local;
  dynbuf *out_local;
  size_t len_local;
  char *in_local;
  
  puStack_40 = (uchar *)(in + len);
  local_44 = CURLE_OK;
  i._7_1_ = lowercase;
  pdStack_28 = out;
  out_local = (dynbuf *)len;
  len_local = (size_t)in;
  for (in_end = (uchar *)in; in_end < puStack_40 && local_44 == CURLE_OK; in_end = in_end + 1) {
    uVar1 = *in_end;
    if (uVar1 == '\b') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\b",2);
    }
    else if (uVar1 == '\t') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\t",2);
    }
    else if (uVar1 == '\n') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\n",2);
    }
    else if (uVar1 == '\f') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\f",2);
    }
    else if (uVar1 == '\r') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\r",2);
    }
    else if (uVar1 == '\"') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\\"",2);
    }
    else if (uVar1 == '\\') {
      local_44 = curlx_dyn_addn(pdStack_28,"\\\\",2);
    }
    else if (*in_end < 0x20) {
      local_44 = curlx_dyn_addf(pdStack_28,"\\u%04x",(ulong)*in_end);
    }
    else {
      local_45 = *in_end;
      if ((((i._7_1_ & 1) != 0) && ('@' < (char)local_45)) && ((char)local_45 < '[')) {
        local_45 = local_45 | 0x20;
      }
      local_44 = curlx_dyn_addn(pdStack_28,&local_45,1);
    }
  }
  if (local_44 == CURLE_OK) {
    in_local._4_4_ = CURLE_OK;
  }
  else {
    in_local._4_4_ = local_44;
  }
  return in_local._4_4_;
}

Assistant:

int jsonquoted(const char *in, size_t len,
               struct curlx_dynbuf *out, bool lowercase)
{
  const unsigned char *i = (const unsigned char *)in;
  const unsigned char *in_end = &i[len];
  CURLcode result = CURLE_OK;

  for(; (i < in_end) && !result; i++) {
    switch(*i) {
    case '\\':
      result = curlx_dyn_addn(out, "\\\\", 2);
      break;
    case '\"':
      result = curlx_dyn_addn(out, "\\\"", 2);
      break;
    case '\b':
      result = curlx_dyn_addn(out, "\\b", 2);
      break;
    case '\f':
      result = curlx_dyn_addn(out, "\\f", 2);
      break;
    case '\n':
      result = curlx_dyn_addn(out, "\\n", 2);
      break;
    case '\r':
      result = curlx_dyn_addn(out, "\\r", 2);
      break;
    case '\t':
      result = curlx_dyn_addn(out, "\\t", 2);
      break;
    default:
      if(*i < 32)
        result = curlx_dyn_addf(out, "\\u%04x", *i);
      else {
        char o = (char)*i;
        if(lowercase && (o >= 'A' && o <= 'Z'))
          /* do not use tolower() since that is locale specific */
          o |= ('a' - 'A');
        result = curlx_dyn_addn(out, &o, 1);
      }
      break;
    }
  }
  if(result)
    return (int)result;
  return 0;
}